

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smodels.cpp
# Opt level: O3

void __thiscall Potassco::SmodelsOutput::assume(SmodelsOutput *this,LitSpan *lits)

{
  int iVar1;
  ostream *poVar2;
  size_t sVar3;
  int *piVar4;
  int *piVar5;
  
  if (1 < this->sec_) {
    fail(-2,"virtual void Potassco::SmodelsOutput::assume(const LitSpan &)",0x164,"sec_ < 2",
         "at most one compute statement supported in smodels format",0);
  }
  do {
    std::ostream::operator<<((ostream *)this->os_,0);
    std::__ostream_insert<char,std::char_traits<char>>(this->os_,"\n",1);
    iVar1 = this->sec_ + 1;
    this->sec_ = iVar1;
  } while (iVar1 != 2);
  std::__ostream_insert<char,std::char_traits<char>>(this->os_,"B+\n",3);
  sVar3 = lits->size;
  if (sVar3 != 0) {
    piVar4 = lits->first;
    piVar5 = piVar4;
    do {
      if (0 < *piVar5) {
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)this->os_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
        piVar4 = lits->first;
        sVar3 = lits->size;
      }
      piVar5 = piVar5 + 1;
    } while (piVar5 != piVar4 + sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->os_,"0\nB-\n",5);
  sVar3 = lits->size;
  if (sVar3 != 0) {
    piVar4 = lits->first;
    piVar5 = piVar4;
    do {
      if (*piVar5 < 0) {
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)this->os_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
        piVar4 = lits->first;
        sVar3 = lits->size;
      }
      piVar5 = piVar5 + 1;
    } while (piVar5 != piVar4 + sVar3);
  }
  if ((this->fHead_ != false) && (this->false_ != 0)) {
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)this->os_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->os_,"0\n",2);
  return;
}

Assistant:

void SmodelsOutput::assume(const LitSpan& lits) {
	POTASSCO_REQUIRE(sec_ < 2, "at most one compute statement supported in smodels format");
	while (sec_ != 2) { startRule(End).endRule(); ++sec_; }
	os_ << "B+\n";
	for (const Lit_t* x = begin(lits); x != end(lits); ++x) {
		if (lit(*x) > 0) { os_ << atom(*x) << "\n"; }
	}
	os_ << "0\nB-\n";
	for (const Lit_t* x = begin(lits); x != end(lits); ++x) {
		if (lit(*x) < 0) { os_ << atom(*x) << "\n"; }
	}
	if (fHead_ && false_) {
		os_ << false_ << "\n";
	}
	os_ << "0\n";
}